

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

HRESULT __thiscall
Js::ScriptContext::OnDebuggerAttachedDetached
          (ScriptContext *this,bool attach,NativeCodeGenerator **previousCodeGenHolder)

{
  int iVar1;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar2;
  Utf8SourceInfo *this_00;
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar3;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_> *pSVar4;
  FunctionBody *pFVar5;
  SListNodeBase<Memory::Recycler> addr;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  DebugContext *pDVar9;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar10;
  undefined4 *puVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ThreadContext *this_01;
  AutoNestedHandledExceptionType local_44;
  ThreadContext *pTStack_40;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  this_01 = this->threadContext;
  this_01->debugManager->isDebuggerAttaching = true;
  ThreadContext::InvalidateAllProtoInlineCaches(this_01);
  ThreadContext::InvalidateAllStoreFieldInlineCaches(this->threadContext);
  ThreadContext::InvalidateAllIsInstInlineCaches(this->threadContext);
  if (!attach) {
    UnRegisterDebugThunk(this);
    pDVar9 = GetDebugContext(this);
    ProbeContainer::RemoveAllProbes(pDVar9->diagProbesContainer);
  }
  if (DAT_015b5f87 == '\0') {
    iVar8 = RecreateNativeCodeGenerator(this,previousCodeGenHolder);
    if (iVar8 < 0) goto LAB_0079925b;
    if (attach) {
      pDVar9 = GetDebugContext(this);
      DebugContext::SetDebuggerMode(pDVar9,Debugging);
      UpdateNativeCodeGeneratorForDebugMode(this->nativeCodeGen);
    }
  }
  else {
    iVar8 = 0;
    if (attach) {
      pDVar9 = GetDebugContext(this);
      DebugContext::SetDebuggerMode(pDVar9,Debugging);
      iVar8 = 0;
    }
  }
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_44,ExceptionType_OutOfMemory);
  pTStack_40 = this_01;
  pLVar10 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(&this->sourceList);
  if (0 < (pLVar10->
          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
          ).count) {
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    lVar12 = 0;
    do {
      pRVar2 = (pLVar10->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar12].ptr;
      if ((((ulong)pRVar2 & 1) == 0 && pRVar2 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
         && (this_00 = (Utf8SourceInfo *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef,
            this_00 != (Utf8SourceInfo *)0x0)) {
        if ((this_00->field_0xa8 & 4) == 0) {
          Utf8SourceInfo::SetInDebugMode(this_00,attach);
          pSVar3 = (this_00->functionBodyDictionary).ptr;
          if ((pSVar3 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                          *)0x0) &&
             ((pSVar3->
              super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ).bucketCount != 0)) {
            uVar14 = 0;
            do {
              iVar13 = (pSVar3->
                       super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).buckets.ptr[uVar14];
              while (iVar13 != -1) {
                pSVar4 = (pSVar3->
                         super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).entries.ptr;
                iVar1 = pSVar4[iVar13].
                        super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .
                        super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                        .
                        super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .next;
                pFVar5 = pSVar4[iVar13].
                         super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .
                         super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .
                         super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                         .
                         super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .value.ptr;
                if (pFVar5 == (FunctionBody *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                              ,0xa2,"(functionBody)","functionBody");
                  if (!bVar7) {
LAB_0079927b:
                    pcVar6 = (code *)invalidInstructionException();
                    (*pcVar6)();
                  }
                  *puVar11 = 0;
                }
                FunctionBody::SetEntryToDeferParseForDebugger(pFVar5);
                iVar13 = iVar1;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < (pSVar3->
                              super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                              ).bucketCount);
          }
        }
        else {
          pSVar3 = (this_00->functionBodyDictionary).ptr;
          if ((pSVar3 != (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                          *)0x0) &&
             ((pSVar3->
              super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ).bucketCount != 0)) {
            uVar14 = 0;
            do {
              iVar13 = (pSVar3->
                       super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).buckets.ptr[uVar14];
              while (iVar13 != -1) {
                pSVar4 = (pSVar3->
                         super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).entries.ptr;
                iVar1 = pSVar4[iVar13].
                        super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .
                        super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                        .
                        super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                        .next;
                pFVar5 = pSVar4[iVar13].
                         super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                         .
                         super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .
                         super_ValueEntry<Memory::WriteBarrierPtr<Js::FunctionBody>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>_>
                         .
                         super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::FunctionBody>_>
                         .value.ptr;
                if (pFVar5 == (FunctionBody *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  *puVar11 = 1;
                  bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                              ,0xa2,"(functionBody)","functionBody");
                  if (!bVar7) goto LAB_0079927b;
                  *puVar11 = 0;
                }
                FunctionBody::ResetEntryPoint(pFVar5);
                iVar13 = iVar1;
              }
              uVar14 = uVar14 + 1;
            } while (uVar14 < (pSVar3->
                              super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                              ).bucketCount);
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pLVar10->
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                      ).count);
  }
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_44);
  this_01 = pTStack_40;
  if (-1 < iVar8) {
    if (attach) {
      RegisterDebugThunk(this,true);
    }
    addr.next.ptr =
         (Type)(((this->super_ScriptContextBase).javascriptLibrary)->cache).profileInfoList.ptr;
    if (addr.next.ptr != (SListNodeBase<Memory::Recycler> *)0x0) {
      Memory::Recycler::WBSetBit((char *)addr.next.ptr);
      *(Type *)addr.next.ptr = addr.next.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)addr.next.ptr);
      *(undefined4 *)((long)addr.next.ptr + 8) = 0;
    }
  }
LAB_0079925b:
  this_01->debugManager->isDebuggerAttaching = false;
  return iVar8;
}

Assistant:

HRESULT ScriptContext::OnDebuggerAttachedDetached(bool attach)
#endif
    {

        // notify threadContext that debugger is attaching so do not do expire
        struct AutoRestore
        {
            AutoRestore(ThreadContext* threadContext)
                :threadContext(threadContext)
            {
                this->threadContext->GetDebugManager()->SetDebuggerAttaching(true);
            }
            ~AutoRestore()
            {
                this->threadContext->GetDebugManager()->SetDebuggerAttaching(false);
            }

        private:
            ThreadContext* threadContext;

        } autoRestore(this->GetThreadContext());

        // Invalidate all the caches.
        this->threadContext->InvalidateAllProtoInlineCaches();
        this->threadContext->InvalidateAllStoreFieldInlineCaches();
        this->threadContext->InvalidateAllIsInstInlineCaches();

        if (!attach)
        {
            this->UnRegisterDebugThunk();

            // Remove all breakpoint probes
            this->GetDebugContext()->GetProbeContainer()->RemoveAllProbes();
        }

        HRESULT hr = S_OK;

        if (!CONFIG_FLAG(ForceDiagnosticsMode))
        {
#if ENABLE_NATIVE_CODEGEN
            // Recreate the native code generator so that all pending
            // JIT work items will be cleared.
            hr = RecreateNativeCodeGenerator(previousCodeGenHolder);
            if (FAILED(hr))
            {
                return hr;
            }
#endif
            if (attach)
            {
                // We need to transition to debug mode after the NativeCodeGenerator is cleared/closed. Since the NativeCodeGenerator will be working on a different thread - it may
                // be checking on the DebuggerState (from ScriptContext) while emitting code.
                this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
#if ENABLE_NATIVE_CODEGEN
                UpdateNativeCodeGeneratorForDebugMode(this->nativeCodeGen);
#endif
            }
        }
        else if (attach)
        {
            this->GetDebugContext()->SetDebuggerMode(Js::DebuggerMode::Debugging);
        }

        BEGIN_TRANSLATE_OOM_TO_HRESULT_NESTED
        {
            // Remap all the function entry point thunks.
            this->sourceList->Map([=](uint i, RecyclerWeakReference<Js::Utf8SourceInfo>* sourceInfoWeakRef) {
                Js::Utf8SourceInfo* sourceInfo = sourceInfoWeakRef->Get();

                if (sourceInfo != nullptr)
                {
                    if (!sourceInfo->GetIsLibraryCode())
                    {
                        sourceInfo->SetInDebugMode(attach);

                        sourceInfo->MapFunction([](Js::FunctionBody* functionBody) {
                            functionBody->SetEntryToDeferParseForDebugger();
                        });
                    }
                    else
                    {
                        sourceInfo->MapFunction([](Js::FunctionBody* functionBody) {
                            functionBody->ResetEntryPoint();
                        });
                    }
                }
            });
        }